

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

uint32_t farmhashsa::Hash32WithSeed(char *s,size_t len,uint32_t seed)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EDX;
  ulong in_RSI;
  uint32_t h;
  size_t in_stack_00000290;
  char *in_stack_00000298;
  uint32_t in_stack_fffffffffffffff4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RSI < 0x19) {
    if (in_RSI < 0xd) {
      if (in_RSI < 5) {
        uVar1 = farmhashmk::Hash32Len0to4
                          ((char *)CONCAT44(seed,h),
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_stack_fffffffffffffff4);
      }
      else {
        uVar1 = farmhashmk::Hash32Len5to12
                          ((char *)CONCAT44(seed,h),
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_stack_fffffffffffffff4);
      }
    }
    else {
      uVar1 = farmhashmk::Hash32Len13to24
                        ((char *)CONCAT44(seed,h),
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_stack_fffffffffffffff4);
    }
  }
  else {
    uVar1 = farmhashmk::Hash32Len13to24
                      ((char *)CONCAT44(seed,h),
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_stack_fffffffffffffff4);
    uVar2 = Hash32(in_stack_00000298,in_stack_00000290);
    uVar1 = crc32(uVar2 + in_EDX,uVar1);
  }
  return uVar1;
}

Assistant:

uint32_t Hash32WithSeed(const char *s, size_t len, uint32_t seed) {
  if (len <= 24) {
    if (len >= 13) return farmhashmk::Hash32Len13to24(s, len, seed * c1);
    else if (len >= 5) return farmhashmk::Hash32Len5to12(s, len, seed);
    else return farmhashmk::Hash32Len0to4(s, len, seed);
  }
  uint32_t h = farmhashmk::Hash32Len13to24(s, 24, seed ^ len);
  return _mm_crc32_u32(Hash32(s + 24, len - 24) + seed, h);
}